

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SwapExtension
          (ExtensionSet *this,ExtensionSet *other,int number)

{
  FieldDescriptor *pFVar1;
  anon_union_8_21_eb924b1f_for_Extension_0 aVar2;
  FieldType FVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  int iVar7;
  FieldType FVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  int iVar12;
  Extension *pEVar13;
  Extension *pEVar14;
  Extension *other_extension;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar15;
  undefined1 auStack_48 [8];
  ExtensionSet temp;
  
  if (this != other) {
    pEVar13 = FindOrNull(this,number);
    pEVar14 = FindOrNull(other,number);
    if (pEVar13 != (Extension *)0x0 || pEVar14 != (Extension *)0x0) {
      if (pEVar14 == (Extension *)0x0 || pEVar13 == (Extension *)0x0) {
        if (pEVar13 == (Extension *)0x0) {
          if (this->arena_ == other->arena_) {
            pVar15 = Insert(this,number);
            pEVar13 = pVar15.first;
            FVar3 = pEVar14->type;
            bVar4 = pEVar14->is_repeated;
            uVar5 = pEVar14->field_0xa;
            bVar6 = pEVar14->is_packed;
            iVar7 = pEVar14->cached_size;
            pEVar13->field_0 = pEVar14->field_0;
            pEVar13->type = FVar3;
            pEVar13->is_repeated = bVar4;
            pEVar13->field_0xa = uVar5;
            pEVar13->is_packed = bVar6;
            pEVar13->cached_size = iVar7;
            pEVar13->descriptor = pEVar14->descriptor;
          }
          else {
            InternalExtensionMergeFrom(this,number,pEVar14);
          }
        }
        else {
          if (pEVar14 != (Extension *)0x0) {
            return;
          }
          if (this->arena_ == other->arena_) {
            pVar15 = Insert(other,number);
            pEVar14 = pVar15.first;
            FVar3 = pEVar13->type;
            bVar4 = pEVar13->is_repeated;
            uVar5 = pEVar13->field_0xa;
            bVar6 = pEVar13->is_packed;
            iVar7 = pEVar13->cached_size;
            pEVar14->field_0 = pEVar13->field_0;
            pEVar14->type = FVar3;
            pEVar14->is_repeated = bVar4;
            pEVar14->field_0xa = uVar5;
            pEVar14->is_packed = bVar6;
            pEVar14->cached_size = iVar7;
            pEVar14->descriptor = pEVar13->descriptor;
            other = this;
          }
          else {
            InternalExtensionMergeFrom(other,number,pEVar13);
            other = this;
          }
        }
        Erase(other,number);
        return;
      }
      if (this->arena_ == other->arena_) {
        pFVar1 = pEVar13->descriptor;
        aVar2 = pEVar13->field_0;
        FVar8 = pEVar13->type;
        bVar9 = pEVar13->is_repeated;
        uVar10 = pEVar13->field_0xa;
        bVar11 = pEVar13->is_packed;
        iVar12 = pEVar13->cached_size;
        pEVar13->descriptor = pEVar14->descriptor;
        FVar3 = pEVar14->type;
        bVar4 = pEVar14->is_repeated;
        uVar5 = pEVar14->field_0xa;
        bVar6 = pEVar14->is_packed;
        iVar7 = pEVar14->cached_size;
        pEVar13->field_0 = pEVar14->field_0;
        pEVar13->type = FVar3;
        pEVar13->is_repeated = bVar4;
        pEVar13->field_0xa = uVar5;
        pEVar13->is_packed = bVar6;
        pEVar13->cached_size = iVar7;
        pEVar14->descriptor = pFVar1;
        pEVar14->field_0 = aVar2;
        pEVar14->type = FVar8;
        pEVar14->is_repeated = bVar9;
        pEVar14->field_0xa = uVar10;
        pEVar14->is_packed = bVar11;
        pEVar14->cached_size = iVar12;
      }
      else {
        ExtensionSet((ExtensionSet *)auStack_48);
        InternalExtensionMergeFrom((ExtensionSet *)auStack_48,number,pEVar14);
        other_extension = FindOrNull((ExtensionSet *)auStack_48,number);
        Extension::Clear(pEVar14);
        InternalExtensionMergeFrom(other,number,pEVar13);
        Extension::Clear(pEVar13);
        InternalExtensionMergeFrom(this,number,other_extension);
        ~ExtensionSet((ExtensionSet *)auStack_48);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::SwapExtension(ExtensionSet* other, int number) {
  if (this == other) return;
  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == NULL && other_ext == NULL) {
    return;
  }

  if (this_ext != NULL && other_ext != NULL) {
    if (GetArena() == other->GetArena()) {
      using std::swap;
      swap(*this_ext, *other_ext);
    } else {
      // TODO(cfallin, rohananil): We could further optimize these cases,
      // especially avoid creation of ExtensionSet, and move MergeFrom logic
      // into Extensions itself (which takes arena as an argument).
      // We do it this way to reuse the copy-across-arenas logic already
      // implemented in ExtensionSet's MergeFrom.
      ExtensionSet temp;
      temp.InternalExtensionMergeFrom(number, *other_ext);
      Extension* temp_ext = temp.FindOrNull(number);
      other_ext->Clear();
      other->InternalExtensionMergeFrom(number, *this_ext);
      this_ext->Clear();
      InternalExtensionMergeFrom(number, *temp_ext);
    }
    return;
  }

  if (this_ext == NULL) {
    if (GetArena() == other->GetArena()) {
      *Insert(number).first = *other_ext;
    } else {
      InternalExtensionMergeFrom(number, *other_ext);
    }
    other->Erase(number);
    return;
  }

  if (other_ext == NULL) {
    if (GetArena() == other->GetArena()) {
      *other->Insert(number).first = *this_ext;
    } else {
      other->InternalExtensionMergeFrom(number, *this_ext);
    }
    Erase(number);
    return;
  }
}